

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univ_map_oa.hpp
# Opt level: O2

bool __thiscall lex_less<const_char_*>::operator()(lex_less<const_char_*> *this,char **x,char **y)

{
  char *__s;
  char *__s_00;
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  
  __s = *x;
  sVar2 = strlen(__s);
  __s_00 = *y;
  sVar3 = strlen(__s_00);
  bVar1 = std::
          __lexicographical_compare_impl<char_const*,char_const*,__gnu_cxx::__ops::_Iter_less_iter>
                    (__s,__s + sVar2,__s_00,__s_00 + sVar3);
  return bVar1;
}

Assistant:

bool operator()(const T &x, const T &y) const
  {
    return (std::lexicographical_compare(x, x + strlen(x), y, y + strlen(y)));
  }